

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache_ptr.cc
# Opt level: O3

Result * tcmalloc::SlowTLS::Lookup(void)

{
  ulong uVar1;
  Entry *pEVar2;
  Result *in_RDI;
  Entry **ppEVar3;
  ulong *in_FS_OFFSET;
  bool bVar4;
  SpinLockHolder local_28;
  SpinLockHolder h;
  
  uVar1 = *in_FS_OFFSET;
  local_28.lock_ = &lock_;
  ppEVar3 = (Entry **)
            ((long)hash_table_ + (ulong)(uint)(((int)uVar1 + (int)(uVar1 / 0x101) * -0x101) * 8));
  LOCK();
  bVar4 = (__atomic_base<int>)lock_.lockword_.super___atomic_base<int>._M_i ==
          (__atomic_base<int>)0x0;
  if (bVar4) {
    lock_.lockword_.super___atomic_base<int>._M_i = (atomic<int>)(__atomic_base<int>)0x1;
  }
  UNLOCK();
  if (!bVar4) {
    SpinLock::SlowLock(&lock_);
  }
  for (pEVar2 = *ppEVar3; pEVar2 != (Entry *)0x0; pEVar2 = pEVar2->next) {
    if (pEVar2->thread_id == uVar1) goto LAB_0011b83f;
  }
  pEVar2 = (Entry *)0x0;
LAB_0011b83f:
  in_RDI->thread_id_ = uVar1;
  in_RDI->ht_place_ = ppEVar3;
  in_RDI->entry_ = pEVar2;
  SpinLockHolder::~SpinLockHolder(&local_28);
  return in_RDI;
}

Assistant:

static Result Lookup() {
    uintptr_t thread_id;
#if defined(__FreeBSD__) || defined(__NetBSD__)
    const bool kIsBSD = true;
#else
    const bool kIsBSD = false;
#endif
    if constexpr (kHaveGoodTLS || kIsBSD) {
      // SelfThreadId is a working, mostly portable and recursion-free
      // thread identifier.
      //
      // However, on FreeBSD and NetBSD thread's errno location for
      // initial thread changes early during process
      // initialization. As runtime facility "switches" from single
      // threaded "mode" to multi-threaded. IMHO a tiny mistake on
      // their part, it adds small overhead too. Outcome is, if we use
      // errno location, we then "leak" very first thread cache
      // instance. Not a disaster, but not great. And
      // thread_dealloc_unittest catches this too. So lets fix it and
      // have tests pass. Other OSes might do the same, but I checked
      // opensolaris, osex, all Linux libc-s, they're all good.
      //
      // Both those BSDs have great Elf-based TLS which also covers
      // this early usage case too. And since it is faster too (no
      // need to call __error or __errno_location), lets use it on all
      // "good-TLS" platforms. We already have tls_data_, so lets use
      // it's address.
      thread_id = reinterpret_cast<uintptr_t>(&ThreadCachePtr::tls_data_);
    } else {
      thread_id = SelfThreadId();
    }
    Entry** ht_place = &hash_table_[std::hash<uintptr_t>{}(thread_id) % kTableSize];

    SpinLockHolder h(&lock_);

    for (Entry* entry = *ht_place; entry != nullptr; entry = entry->next) {
      if (entry->thread_id == thread_id) {
        return Result{thread_id, ht_place, entry};
      }
    }

    return Result{thread_id, ht_place, nullptr};
  }